

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aq.c
# Opt level: O0

int aq_add_frame(aq_t *q,mp3_frame_t *frame)

{
  uint uVar1;
  unsigned_long uVar2;
  int size_before;
  int back_ptr;
  mp3_frame_t *frame_local;
  aq_t *q_local;
  
  if (q == (aq_t *)0x0) {
    __assert_fail("q != NULL","/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/aq.c",
                  0x133,"int aq_add_frame(aq_t *, mp3_frame_t *)");
  }
  if (frame != (mp3_frame_t *)0x0) {
    uVar1 = (frame->si).main_data_end;
    uVar2 = q->size;
    if (frame->frame_data_size + (long)(int)uVar1 < frame->adu_size) {
      fprintf(_stderr,"Broken frame, skipping...\n");
      q_local._4_4_ = 0;
    }
    else {
      if (frame->frame_data_size + (long)(int)uVar1 < frame->adu_size) {
        __assert_fail("frame->adu_size <= (frame->frame_data_size + back_ptr)",
                      "/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/aq.c",0x13f,
                      "int aq_add_frame(aq_t *, mp3_frame_t *)");
      }
      aq_enqueue_frame(q,frame);
      if (((int)uVar2 < (int)uVar1) || (q->size < frame->adu_size)) {
        q_local._4_4_ = 0;
      }
      else {
        aq_make_adu(q);
        q_local._4_4_ = 1;
      }
    }
    return q_local._4_4_;
  }
  __assert_fail("frame != NULL","/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/aq.c"
                ,0x134,"int aq_add_frame(aq_t *, mp3_frame_t *)");
}

Assistant:

int aq_add_frame(aq_t *q, mp3_frame_t *frame) {
  assert(q != NULL);
  assert(frame != NULL);

  int back_ptr    = frame->si.main_data_end;
  int size_before = q->size;

  /* discard broken frames */
  if (frame->adu_size > (frame->frame_data_size + back_ptr)) {
    fprintf(stderr, "Broken frame, skipping...\n");
    return 0;
  }

  assert(frame->adu_size <= (frame->frame_data_size + back_ptr));
  
  aq_enqueue_frame(q, frame);

  if ((size_before < back_ptr) ||
      (q->size < frame->adu_size))
    return 0;

  aq_make_adu(q);
  return 1;
}